

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

bool __thiscall TypeInfo::testInBuiltTypesOnAttributes(TypeInfo *this,bool DTDPresent)

{
  bool bVar1;
  XMLCh *pXVar2;
  DOMElement *pDVar3;
  long *plVar4;
  XMLCh *pXVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  wchar16 *pwVar9;
  bool local_d11;
  bool local_cd1;
  bool local_c91;
  bool local_c59;
  bool local_c21;
  bool local_be9;
  bool local_bb1;
  bool local_b79;
  bool local_b41;
  bool local_b09;
  bool local_ad1;
  bool local_a99;
  bool local_a61;
  bool local_a29;
  bool local_9f1;
  bool local_9b9;
  bool local_981;
  bool local_949;
  bool local_911;
  bool local_8d9;
  bool local_8a1;
  bool local_869;
  bool local_831;
  bool local_7f9;
  bool local_7c1;
  bool local_789;
  bool local_751;
  bool local_719;
  bool local_6e1;
  bool local_6a9;
  bool local_671;
  bool local_639;
  bool local_601;
  bool local_5c9;
  bool local_591;
  bool local_559;
  bool local_521;
  bool local_4e9;
  bool local_4b1;
  bool local_479;
  bool local_441;
  bool local_409;
  bool local_3d1;
  bool local_399;
  bool local_361;
  bool local_329;
  bool local_2f1;
  bool local_2b9;
  bool local_232;
  XStr local_1f8;
  XStr local_1f0;
  XStr local_1e8;
  XStr local_1e0;
  XStr local_1d8;
  XStr local_1d0;
  XStr local_1c8;
  XStr local_1c0;
  XStr local_1b8;
  XStr local_1b0;
  XStr local_1a8;
  XStr local_1a0;
  XStr local_198;
  XStr local_190;
  XStr local_188;
  XStr local_180;
  XStr local_178;
  XStr local_170;
  XStr local_168;
  XStr local_160;
  XStr local_158;
  XStr local_150;
  XStr local_148;
  XStr local_140;
  XStr local_138;
  XStr local_130;
  XStr local_128;
  XStr local_120;
  XStr local_118;
  XStr local_110;
  XStr local_108;
  XStr local_100;
  XStr local_f8;
  XStr local_f0;
  XStr local_e8;
  XStr local_e0;
  XStr local_d8;
  XStr local_d0;
  XStr local_c8;
  XStr local_c0;
  XStr local_b8;
  XStr local_b0;
  XStr local_a8;
  XStr local_a0;
  XStr local_98;
  XStr local_90;
  XStr local_88;
  XStr local_80;
  XStr local_78;
  XStr local_70;
  long *local_68;
  DOMAttr *testAttr;
  XStr local_58;
  byte local_49;
  XStr local_48;
  XStr local_40 [3];
  XStr local_28;
  DOMElement *local_20;
  DOMElement *testEle;
  bool passed;
  TypeInfo *pTStack_10;
  bool DTDPresent_local;
  TypeInfo *this_local;
  
  testEle._6_1_ = 1;
  testEle._7_1_ = DTDPresent;
  pTStack_10 = this;
  XStr::XStr(&local_28,"attrTest");
  pXVar2 = XStr::unicodeForm(&local_28);
  pDVar3 = findElement(this,pXVar2);
  XStr::~XStr(&local_28);
  local_20 = pDVar3;
  plVar4 = (long *)(**(code **)(*(long *)pDVar3 + 0x1d8))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  XStr::XStr(local_40,"attrTestType");
  local_49 = 0;
  pXVar5 = XStr::unicodeForm(local_40);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  local_232 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*(long *)local_20 + 0x1d8))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    XStr::XStr(&local_48,"");
    local_49 = 1;
    pXVar5 = XStr::unicodeForm(&local_48);
    local_232 = xercesc_4_0::XMLString::equals(pXVar2,pXVar5);
  }
  tmp = local_232;
  if ((local_49 & 1) != 0) {
    XStr::~XStr(&local_48);
  }
  XStr::~XStr(local_40);
  if ((tmp & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa0);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_58,"attrTestType");
    pXVar2 = XStr::unicodeForm(&local_58);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr((XStr *)&testAttr,"");
    pXVar2 = XStr::unicodeForm((XStr *)&testAttr);
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (pXVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr((XStr *)&testAttr);
    XStr::~XStr(&local_58);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*(long *)local_20 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_20 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*(long *)local_20 + 0x1d8))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*(long *)local_20 + 0x1d8))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_70,"anySimpleType");
  pXVar2 = XStr::unicodeForm(&local_70);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_70);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE);
  local_2b9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_2b9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_2b9;
  if (local_2b9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa5);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYSIMPLETYPE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_78,"string");
  pXVar2 = XStr::unicodeForm(&local_78);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_78);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  local_2f1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_2f1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_2f1;
  if (local_2f1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xa8);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_80,"boolean");
  pXVar2 = XStr::unicodeForm(&local_80);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_80);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN);
  local_329 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_329 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_329;
  if (local_329 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xab);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_88,"decimal");
  pXVar2 = XStr::unicodeForm(&local_88);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_88);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
  local_361 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_361 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_361;
  if (local_361 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xae);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_90,"float");
  pXVar2 = XStr::unicodeForm(&local_90);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_90);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
  local_399 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_399 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_399;
  if (local_399 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_98,"double");
  pXVar2 = XStr::unicodeForm(&local_98);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_98);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
  local_3d1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_3d1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_3d1;
  if (local_3d1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb4);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_a0,"duration");
  pXVar2 = XStr::unicodeForm(&local_a0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_a0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION)
  ;
  local_409 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_409 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_409;
  if (local_409 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xb7);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_a8,"dateTime");
  pXVar2 = XStr::unicodeForm(&local_a8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_a8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME)
  ;
  local_441 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_441 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_441;
  if (local_441 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xba);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_b0,"time");
  pXVar2 = XStr::unicodeForm(&local_b0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_b0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TIME);
  local_479 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_479 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_479;
  if (local_479 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xbd);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TIME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_b8,"date");
  pXVar2 = XStr::unicodeForm(&local_b8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_b8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
  local_4b1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_4b1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_4b1;
  if (local_4b1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc0);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DATE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_c0,"gYearMonth");
  pXVar2 = XStr::unicodeForm(&local_c0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_c0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
  local_4e9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_4e9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_4e9;
  if (local_4e9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc3);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_c8,"gYear");
  pXVar2 = XStr::unicodeForm(&local_c8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_c8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR);
  local_521 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_521 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_521;
  if (local_521 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc6);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_d0,"gMonthDay");
  pXVar2 = XStr::unicodeForm(&local_d0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_d0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY)
  ;
  local_559 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_559 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_559;
  if (local_559 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xc9);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_d8,"gDay");
  pXVar2 = XStr::unicodeForm(&local_d8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_d8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
  local_591 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_591 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_591;
  if (local_591 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcc);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_DAY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_e0,"gMonth");
  pXVar2 = XStr::unicodeForm(&local_e0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_e0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
  local_5c9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_5c9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_5c9;
  if (local_5c9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xcf);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_e8,"hexBinary");
  pXVar2 = XStr::unicodeForm(&local_e8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_e8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY);
  local_601 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_601 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_601;
  if (local_601 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd2);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_f0,"base64Binary");
  pXVar2 = XStr::unicodeForm(&local_f0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_f0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
  local_639 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_639 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_639;
  if (local_639 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd5);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_f8,"anyURI");
  pXVar2 = XStr::unicodeForm(&local_f8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_f8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  local_671 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_671 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_671;
  if (local_671 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xd8);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_100,"QName");
  pXVar2 = XStr::unicodeForm(&local_100);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_100);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME);
  local_6a9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_6a9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_6a9;
  if (local_6a9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xdb);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_QNAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_108,"normalizedString");
  pXVar2 = XStr::unicodeForm(&local_108);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_108);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING);
  local_6e1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_6e1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_6e1;
  if (local_6e1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xde);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NORMALIZEDSTRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_110,"token");
  pXVar2 = XStr::unicodeForm(&local_110);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_110);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN);
  local_719 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_719 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_719;
  if (local_719 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_TOKEN,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_118,"language");
  pXVar2 = XStr::unicodeForm(&local_118);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_118);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE)
  ;
  local_751 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_751 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_751;
  if (local_751 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe4);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LANGUAGE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_120,"NMTOKEN");
  pXVar2 = XStr::unicodeForm(&local_120);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_120);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokenString);
  local_789 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_789 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_789;
  if (local_789 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe7);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokenString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_128,"NMTOKENS");
  pXVar2 = XStr::unicodeForm(&local_128);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_128);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgNmTokensString);
  local_7c1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_7c1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_7c1;
  if (local_7c1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xea);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgNmTokensString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_130,"Name");
  pXVar2 = XStr::unicodeForm(&local_130);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_130);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NAME);
  local_7f9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_7f9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_7f9;
  if (local_7f9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xed);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_138,"NCName");
  pXVar2 = XStr::unicodeForm(&local_138);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_138);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME);
  local_831 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_831 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_831;
  if (local_831 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf0);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NCNAME,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_140,"ID");
  pXVar2 = XStr::unicodeForm(&local_140);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_140);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgIDString);
  local_869 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_869 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_869;
  if (local_869 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf3);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_148,"IDREF");
  pXVar2 = XStr::unicodeForm(&local_148);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_148);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgIDRefString);
  local_8a1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_8a1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_8a1;
  if (local_8a1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf6);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_150,"IDREFS");
  pXVar2 = XStr::unicodeForm(&local_150);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_150);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgIDRefsString);
  local_8d9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_8d9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_8d9;
  if (local_8d9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xf9);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::XMLUni::fgIDRefsString,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  if ((testEle._7_1_ & 1) != 0) {
    XStr::XStr(&local_158,"ENTITY");
    pXVar2 = XStr::unicodeForm(&local_158);
    local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
    XStr::~XStr(&local_158);
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
    bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgEntityString);
    local_911 = false;
    if (bVar1) {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
      local_911 = xercesc_4_0::XMLString::equals
                            (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    }
    tmp = local_911;
    if (local_911 == false) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xfe);
      poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 ((wchar16 *)&xercesc_4_0::XMLUni::fgEntityString,
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6,"\', uri \'");
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<(poVar6,pcVar7);
      std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      lVar8 = (**(code **)(*plVar4 + 0x10))();
      if (lVar8 == 0) {
        std::operator<<((ostream *)&std::cerr,"(null)");
      }
      else {
        plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
        pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
        pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        std::operator<<((ostream *)&std::cerr,pcVar7);
      }
      std::operator<<((ostream *)&std::cerr,"\', uri \'");
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      lVar8 = (**(code **)(*plVar4 + 0x18))();
      if (lVar8 == 0) {
        std::operator<<((ostream *)&std::cerr,"(null)");
      }
      else {
        plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
        pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
        pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        std::operator<<((ostream *)&std::cerr,pcVar7);
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      testEle._6_1_ = 0;
    }
    pDVar3 = local_20;
    XStr::XStr(&local_160,"ENTITIES");
    pXVar2 = XStr::unicodeForm(&local_160);
    local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
    XStr::~XStr(&local_160);
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
    bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::XMLUni::fgEntitiesString);
    local_949 = false;
    if (bVar1) {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
      local_949 = xercesc_4_0::XMLString::equals
                            (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    }
    tmp = local_949;
    if (local_949 == false) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x101);
      poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 ((wchar16 *)&xercesc_4_0::XMLUni::fgEntitiesString,
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      poVar6 = std::operator<<(poVar6,pcVar7);
      poVar6 = std::operator<<(poVar6,"\', uri \'");
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                  xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<(poVar6,pcVar7);
      std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      lVar8 = (**(code **)(*plVar4 + 0x10))();
      if (lVar8 == 0) {
        std::operator<<((ostream *)&std::cerr,"(null)");
      }
      else {
        plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
        pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
        pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        std::operator<<((ostream *)&std::cerr,pcVar7);
      }
      std::operator<<((ostream *)&std::cerr,"\', uri \'");
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      lVar8 = (**(code **)(*plVar4 + 0x18))();
      if (lVar8 == 0) {
        std::operator<<((ostream *)&std::cerr,"(null)");
      }
      else {
        plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
        pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
        pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                   (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        std::operator<<((ostream *)&std::cerr,pcVar7);
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      testEle._6_1_ = 0;
    }
  }
  pDVar3 = local_20;
  XStr::XStr(&local_168,"integer");
  pXVar2 = XStr::unicodeForm(&local_168);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_168);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  local_981 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_981 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_981;
  if (local_981 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x105);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_170,"nonPositiveInteger");
  pXVar2 = XStr::unicodeForm(&local_170);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_170);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
  local_9b9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_9b9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_9b9;
  if (local_9b9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x108);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_178,"negativeInteger");
  pXVar2 = XStr::unicodeForm(&local_178);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_178);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER);
  local_9f1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_9f1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_9f1;
  if (local_9f1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10b);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_180,"long");
  pXVar2 = XStr::unicodeForm(&local_180);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_180);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LONG);
  local_a29 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_a29 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_a29;
  if (local_a29 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x10e);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_LONG,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_188,"int");
  pXVar2 = XStr::unicodeForm(&local_188);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_188);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
  local_a61 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_a61 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_a61;
  if (local_a61 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x111);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_190,"short");
  pXVar2 = XStr::unicodeForm(&local_190);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_190);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
  local_a99 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_a99 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_a99;
  if (local_a99 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x114);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_198,"byte");
  pXVar2 = XStr::unicodeForm(&local_198);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_198);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
  local_ad1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_ad1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_ad1;
  if (local_ad1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x117);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1a0,"nonNegativeInteger");
  pXVar2 = XStr::unicodeForm(&local_1a0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1a0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
  local_b09 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_b09 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_b09;
  if (local_b09 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11a);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1a8,"unsignedLong");
  pXVar2 = XStr::unicodeForm(&local_1a8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1a8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG);
  local_b41 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_b41 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_b41;
  if (local_b41 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x11d);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1b0,"unsignedInt");
  pXVar2 = XStr::unicodeForm(&local_1b0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1b0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
  local_b79 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_b79 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_b79;
  if (local_b79 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x120);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UINT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1b8,"unsignedShort");
  pXVar2 = XStr::unicodeForm(&local_1b8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1b8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
  local_bb1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_bb1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_bb1;
  if (local_bb1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x123);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1c0,"unsignedByte");
  pXVar2 = XStr::unicodeForm(&local_1c0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1c0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
  local_be9 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_be9 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_be9;
  if (local_be9 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x126);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1c8,"positiveInteger");
  pXVar2 = XStr::unicodeForm(&local_1c8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1c8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals
                    (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
  local_c21 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_c21 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_c21;
  if (local_c21 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x129);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1d0,"defaultString");
  pXVar2 = XStr::unicodeForm(&local_1d0);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1d0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_STRING);
  local_c59 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_c59 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_c59;
  if (local_c59 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x12d);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_STRING,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1d8,"defaultInt");
  pXVar2 = XStr::unicodeForm(&local_1d8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,0,pXVar2);
  XStr::~XStr(&local_1d8);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
  local_c91 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_c91 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_c91;
  if (local_c91 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x130);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1e0,"http://www.w3.org/2000/xmlns/");
  pXVar2 = XStr::unicodeForm(&local_1e0);
  XStr::XStr(&local_1e8,"prefix");
  pXVar5 = XStr::unicodeForm(&local_1e8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,pXVar2,pXVar5);
  XStr::~XStr(&local_1e8);
  XStr::~XStr(&local_1e0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  local_cd1 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_cd1 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_cd1;
  if (local_cd1 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x134);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  pDVar3 = local_20;
  XStr::XStr(&local_1f0,"http://www.w3.org/2001/XMLSchema-instance");
  pXVar2 = XStr::unicodeForm(&local_1f0);
  XStr::XStr(&local_1f8,"noNamespaceSchemaLocation");
  pXVar5 = XStr::unicodeForm(&local_1f8);
  local_68 = (long *)(**(code **)(*(long *)pDVar3 + 0x198))(pDVar3,pXVar2,pXVar5);
  XStr::~XStr(&local_1f8);
  XStr::~XStr(&local_1f0);
  plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
  pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x10))();
  bVar1 = xercesc_4_0::XMLString::equals(pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI);
  local_d11 = false;
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    pXVar2 = (XMLCh *)(**(code **)(*plVar4 + 0x18))();
    local_d11 = xercesc_4_0::XMLString::equals
                          (pXVar2,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  tmp = local_d11;
  if (local_d11 == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x137);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgDT_ANYURI,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x10))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
    lVar8 = (**(code **)(*plVar4 + 0x18))();
    if (lVar8 == 0) {
      std::operator<<((ostream *)&std::cerr,"(null)");
    }
    else {
      plVar4 = (long *)(**(code **)(*local_68 + 0x170))();
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))();
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      std::operator<<((ostream *)&std::cerr,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    testEle._6_1_ = 0;
  }
  return (bool)(testEle._6_1_ & 1);
}

Assistant:

bool TypeInfo::testInBuiltTypesOnAttributes(bool DTDPresent) {

    bool passed = true;
    DOMElement *testEle = findElement(X("attrTest"));

    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("attrTestType"), X(""), __LINE__);

    DOMAttr *testAttr;

    testAttr = testEle->getAttributeNodeNS(0, X("anySimpleType"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYSIMPLETYPE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("string"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("boolean"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BOOLEAN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("decimal"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DECIMAL, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("float"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_FLOAT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("double"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DOUBLE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("duration"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DURATION, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("dateTime"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATETIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("time"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TIME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("date"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DATE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYearMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEARMONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gYear"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_YEAR, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonthDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTHDAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gDay"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_DAY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("gMonth"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_MONTH, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("hexBinary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_HEXBINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("base64Binary"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BASE64BINARY, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("anyURI"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("QName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_QNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("normalizedString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NORMALIZEDSTRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("token"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_TOKEN, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("language"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LANGUAGE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKEN"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokenString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NMTOKENS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgNmTokensString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("Name"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("NCName"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NCNAME, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("ID"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREF"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("IDREFS"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgIDRefsString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);


    if(DTDPresent) {
        testAttr = testEle->getAttributeNodeNS(0, X("ENTITY"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntityString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

        testAttr = testEle->getAttributeNodeNS(0, X("ENTITIES"));
        DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), XMLUni::fgEntitiesString, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    }

    testAttr = testEle->getAttributeNodeNS(0, X("integer"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonPositiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONPOSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("negativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("long"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_LONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("int"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("short"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_SHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("byte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_BYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("nonNegativeInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_NONNEGATIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedLong"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ULONG, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UINT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedShort"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_USHORT, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("unsignedByte"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_UBYTE, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("positiveInteger"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_POSITIVEINTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //couple of defaulted ones
    testAttr = testEle->getAttributeNodeNS(0, X("defaultString"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_STRING, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(0, X("defaultInt"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_INTEGER, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    //ns attr
    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2000/xmlns/"), X("prefix"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testAttr = testEle->getAttributeNodeNS(X("http://www.w3.org/2001/XMLSchema-instance"), X("noNamespaceSchemaLocation"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), SchemaSymbols::fgDT_ANYURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;
}